

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void * xmlHashLookup3(xmlHashTablePtr table,xmlChar *name,xmlChar *name2,xmlChar *name3)

{
  int iVar1;
  unsigned_long uVar2;
  _xmlHashEntry *p_Var3;
  _xmlHashEntry *p_Var4;
  
  if (name != (xmlChar *)0x0 && table != (xmlHashTablePtr)0x0) {
    uVar2 = xmlHashComputeKey(table,name,name2,name3);
    if (table->table[uVar2].valid != 0) {
      p_Var4 = table->table + uVar2;
      p_Var3 = p_Var4;
      if (table->dict != (xmlDictPtr)0x0) {
        for (; p_Var3 != (_xmlHashEntry *)0x0; p_Var3 = p_Var3->next) {
          if (((p_Var3->name == name) && (p_Var3->name2 == name2)) && (p_Var3->name3 == name3))
          goto LAB_001485b1;
        }
      }
      while (p_Var3 = p_Var4, p_Var3 != (_xmlHashEntry *)0x0) {
        iVar1 = xmlStrEqual(p_Var3->name,name);
        if (((iVar1 != 0) && (iVar1 = xmlStrEqual(p_Var3->name2,name2), iVar1 != 0)) &&
           (iVar1 = xmlStrEqual(p_Var3->name3,name3), iVar1 != 0)) {
LAB_001485b1:
          return p_Var3->payload;
        }
        p_Var4 = p_Var3->next;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *
xmlHashLookup3(xmlHashTablePtr table, const xmlChar *name,
	       const xmlChar *name2, const xmlChar *name3) {
    unsigned long key;
    xmlHashEntryPtr entry;

    if (table == NULL)
	return(NULL);
    if (name == NULL)
	return(NULL);
    key = xmlHashComputeKey(table, name, name2, name3);
    if (table->table[key].valid == 0)
	return(NULL);
    if (table->dict) {
	for (entry = &(table->table[key]); entry != NULL; entry = entry->next) {
	    if ((entry->name == name) &&
		(entry->name2 == name2) &&
		(entry->name3 == name3))
		return(entry->payload);
	}
    }
    for (entry = &(table->table[key]); entry != NULL; entry = entry->next) {
	if ((xmlStrEqual(entry->name, name)) &&
	    (xmlStrEqual(entry->name2, name2)) &&
	    (xmlStrEqual(entry->name3, name3)))
	    return(entry->payload);
    }
    return(NULL);
}